

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O1

SystemTimingCheckSymbol *
slang::ast::SystemTimingCheckSymbol::fromSyntax(Scope *parent,SystemTimingCheckSyntax *syntax)

{
  Token *this;
  char *pcVar1;
  Compilation *this_00;
  uint uVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  undefined8 __n;
  Info *__s1;
  int iVar10;
  uint64_t uVar11;
  Diagnostic *this_01;
  SystemTimingCheckSymbol *pSVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  SourceRange sourceRange;
  string_view arg;
  value_type *elements;
  SourceLocation local_50;
  Token local_48;
  SystemTimingCheckDef *local_38;
  
  this = &syntax->name;
  local_48 = (Token)parsing::Token::valueText(this);
  uVar11 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      &SystemTimingCheckDefs,
                      (basic_string_view<char,_std::char_traits<char>_> *)&local_48);
  lVar9 = DAT_006f6ce8;
  lVar8 = DAT_006f6ce0;
  uVar7 = DAT_006f6cd8;
  uVar16 = uVar11 >> (SystemTimingCheckDefs & 0x3f);
  lVar17 = (uVar11 & 0xff) * 4;
  cVar3 = (&UNK_0051f39c)[lVar17];
  cVar4 = (&UNK_0051f39d)[lVar17];
  cVar5 = (&UNK_0051f39e)[lVar17];
  cVar6 = (&UNK_0051f39f)[lVar17];
  __n = local_48._0_8_;
  __s1 = local_48.info;
  uVar14 = 0;
  do {
    pcVar1 = (char *)(lVar8 + uVar16 * 0x10);
    auVar19[0] = -(*pcVar1 == cVar3);
    auVar19[1] = -(pcVar1[1] == cVar4);
    auVar19[2] = -(pcVar1[2] == cVar5);
    auVar19[3] = -(pcVar1[3] == cVar6);
    auVar19[4] = -(pcVar1[4] == cVar3);
    auVar19[5] = -(pcVar1[5] == cVar4);
    auVar19[6] = -(pcVar1[6] == cVar5);
    auVar19[7] = -(pcVar1[7] == cVar6);
    auVar19[8] = -(pcVar1[8] == cVar3);
    auVar19[9] = -(pcVar1[9] == cVar4);
    auVar19[10] = -(pcVar1[10] == cVar5);
    auVar19[0xb] = -(pcVar1[0xb] == cVar6);
    auVar19[0xc] = -(pcVar1[0xc] == cVar3);
    auVar19[0xd] = -(pcVar1[0xd] == cVar4);
    auVar19[0xe] = -(pcVar1[0xe] == cVar5);
    auVar19[0xf] = -(pcVar1[0xf] == cVar6);
    uVar13 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe);
    if (uVar13 != 0) {
      lVar17 = lVar9 + uVar16 * 0x348;
      do {
        uVar2 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        bVar18 = __n == *(size_t *)(lVar17 + (ulong)uVar2 * 0x38);
        lVar15 = lVar17 + (ulong)uVar2 * 0x38;
        if (bVar18 && __n != 0) {
          iVar10 = bcmp(__s1,*(void **)(lVar15 + 8),__n);
          bVar18 = iVar10 == 0;
        }
        if (bVar18) goto LAB_001504cb;
        uVar13 = uVar13 - 1 & uVar13;
      } while (uVar13 != 0);
    }
    if ((*(byte *)(uVar16 * 0x10 + lVar8 + 0xf) &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar11 & 7]) == 0) break;
    lVar17 = uVar16 + uVar14;
    uVar14 = uVar14 + 1;
    uVar16 = lVar17 + 1U & uVar7;
  } while (uVar14 <= uVar7);
  lVar15 = 0;
LAB_001504cb:
  if (lVar15 == 0) {
    sourceRange = parsing::Token::range(this);
    this_01 = Scope::addDiag(parent,(DiagCode)0xd20006,sourceRange);
    arg = parsing::Token::valueText(this);
    Diagnostic::operator<<(this_01,arg);
    local_38 = (SystemTimingCheckDef *)0x0;
  }
  else {
    local_38 = (SystemTimingCheckDef *)(lVar15 + 0x10);
  }
  this_00 = parent->compilation;
  local_48 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax);
  local_50 = parsing::Token::location(&local_48);
  pSVar12 = BumpAllocator::
            emplace<slang::ast::SystemTimingCheckSymbol,slang::SourceLocation,slang::ast::SystemTimingCheckDef_const*&>
                      (&this_00->super_BumpAllocator,&local_50,&local_38);
  (pSVar12->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  return pSVar12;
}

Assistant:

SystemTimingCheckSymbol& SystemTimingCheckSymbol::fromSyntax(
    const Scope& parent, const SystemTimingCheckSyntax& syntax) {

    const SystemTimingCheckDef* def;
    if (auto it = SystemTimingCheckDefs.find(syntax.name.valueText());
        it != SystemTimingCheckDefs.end()) {
        def = &it->second;
    }
    else {
        parent.addDiag(diag::UnknownSystemTimingCheck, syntax.name.range())
            << syntax.name.valueText();
        def = nullptr;
    }

    auto& comp = parent.getCompilation();
    auto result = comp.emplace<SystemTimingCheckSymbol>(syntax.getFirstToken().location(), def);
    result->setSyntax(syntax);
    return *result;
}